

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O1

void __thiscall
directed_flag_complex_t::worker_thread<directed_flag_complex_computer::add_cell_index_to_cache_t>
          (directed_flag_complex_t *this,size_t number_of_threads,int thread_id,
          add_cell_index_to_cache_t *f,int min_dimension,int max_dimension)

{
  int max_dimension_00;
  void *pvVar1;
  ulong uVar2;
  undefined4 in_register_0000008c;
  ulong uVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> first_position_vertices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  allocator_type local_7d;
  int local_7c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  add_cell_index_to_cache_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,max_dimension);
  uVar3 = (ulong)(this->graph->super_directed_graph_t).number_of_vertices;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  uVar2 = (ulong)thread_id;
  local_7c = min_dimension;
  local_40 = f;
  if (uVar2 < uVar3) {
    do {
      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start._0_2_ = (unsigned_short)uVar2;
      if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_58);
      }
      else {
        *local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_short)
             local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar2 = uVar2 + number_of_threads;
    } while (uVar2 < uVar3);
  }
  max_dimension_00 = (int)local_38;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_58,(long)(max_dimension_00 + 1),&local_7d);
  do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
            (this,local_40,local_7c,max_dimension_00,&local_78,
             (vertex_index_t *)
             CONCAT62(local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start._2_6_,
                      (unsigned_short)
                      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start),0);
  pvVar1 = (void *)CONCAT62(local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start._2_6_,
                            (unsigned_short)
                            local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void worker_thread(size_t number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const size_t number_of_vertices = graph.vertex_number();

		std::vector<vertex_index_t> first_position_vertices;
		for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads)
			first_position_vertices.push_back(vertex_index_t(index));

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		do_for_each_cell(f, min_dimension, max_dimension, first_position_vertices, prefix.data(), 0);

		f.done();
	}